

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

bool __thiscall
soul::ResolutionPass::ModuleInstanceResolver::validateSpecialisationParam
          (ModuleInstanceResolver *this,ASTObject *param,bool shouldIgnoreErrors)

{
  char cVar1;
  UsingDeclaration *pUVar3;
  Expression *pEVar4;
  ProcessorAliasDeclaration *pPVar5;
  VariableDeclaration *pVVar6;
  NamespaceAliasDeclaration *pNVar7;
  bool bVar8;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> n;
  pool_ptr<soul::AST::VariableDeclaration> v;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> pa;
  pool_ptr<soul::AST::UsingDeclaration> u;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> local_120;
  pool_ptr<soul::AST::ProcessorBase> local_118;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> local_110;
  pool_ptr<soul::AST::UsingDeclaration> local_108;
  pool_ptr<soul::AST::Namespace> local_100;
  CompileMessage local_f8;
  CompileMessage local_c0;
  CompileMessage local_88;
  CompileMessage local_50;
  int iVar2;
  
  cast<soul::AST::UsingDeclaration,soul::AST::ASTObject>((soul *)&local_108,param);
  if (local_108.object == (UsingDeclaration *)0x0) {
    cast<soul::AST::ProcessorAliasDeclaration,soul::AST::ASTObject>((soul *)&local_110,param);
    if (local_110.object == (ProcessorAliasDeclaration *)0x0) {
      cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>((soul *)&local_118,param);
      if (local_118.object == (ProcessorBase *)0x0) {
        cast<soul::AST::NamespaceAliasDeclaration,soul::AST::ASTObject>((soul *)&local_120,param);
        if (local_120.object == (NamespaceAliasDeclaration *)0x0) {
          return false;
        }
        pNVar7 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_120);
        if ((pNVar7->targetNamespace).object != (Expression *)0x0) {
          pNVar7 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_120);
          pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&pNVar7->targetNamespace);
          (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[7])(&local_100,pEVar4);
          pNVar7 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_120);
          (pNVar7->resolvedNamespace).object = local_100.object;
          pNVar7 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_120);
          bVar8 = (pNVar7->resolvedNamespace).object != (Namespace *)0x0;
          if (shouldIgnoreErrors || bVar8) {
            return bVar8;
          }
          pNVar7 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_120);
          pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&pNVar7->targetNamespace);
          Errors::expectedNamespaceName<>();
          AST::Context::throwError
                    (&(pEVar4->super_Statement).super_ASTObject.context,&local_f8,false);
        }
      }
      else {
        pVVar6 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                           ((pool_ptr<soul::AST::VariableDeclaration> *)&local_118);
        if ((pVVar6->initialValue).object != (Expression *)0x0) {
          pVVar6 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                             ((pool_ptr<soul::AST::VariableDeclaration> *)&local_118);
          pEVar4 = pool_ptr<soul::AST::Expression>::operator*(&pVVar6->initialValue);
          if (pEVar4->kind == value) {
            iVar2 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar4);
            cVar1 = (char)iVar2;
          }
          else {
            cVar1 = '\0';
          }
          if (shouldIgnoreErrors || cVar1 != '\0') {
            return (bool)cVar1;
          }
          pVVar6 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                             ((pool_ptr<soul::AST::VariableDeclaration> *)&local_118);
          pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&pVVar6->initialValue);
          Errors::expectedValue<>();
          AST::Context::throwError
                    (&(pEVar4->super_Statement).super_ASTObject.context,&local_c0,false);
        }
      }
    }
    else {
      pPVar5 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_110);
      if ((pPVar5->targetProcessor).object != (Expression *)0x0) {
        pPVar5 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_110);
        pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&pPVar5->targetProcessor);
        (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_118,pEVar4);
        pPVar5 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_110);
        (pPVar5->resolvedProcessor).object = local_118.object;
        pPVar5 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_110);
        bVar8 = (pPVar5->resolvedProcessor).object != (ProcessorBase *)0x0;
        if (shouldIgnoreErrors || bVar8) {
          return bVar8;
        }
        pPVar5 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_110);
        pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&pPVar5->targetProcessor);
        Errors::expectedProcessorName<>();
        AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_88,false)
        ;
      }
    }
  }
  else {
    pUVar3 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&local_108);
    if ((pUVar3->targetType).object != (Expression *)0x0) {
      pUVar3 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&local_108);
      pEVar4 = pool_ptr<soul::AST::Expression>::operator*(&pUVar3->targetType);
      if (pEVar4->kind == type) {
        iVar2 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar4);
        cVar1 = (char)iVar2;
      }
      else {
        cVar1 = '\0';
      }
      if (shouldIgnoreErrors || cVar1 != '\0') {
        return (bool)cVar1;
      }
      pUVar3 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&local_108);
      pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&pUVar3->targetType);
      Errors::expectedType<>();
      AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_50,false);
    }
  }
  return true;
}

Assistant:

bool validateSpecialisationParam (AST::ASTObject& param, bool shouldIgnoreErrors) const
        {
            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                if (u->targetType == nullptr)
                    return true;

                if (AST::isResolvedAsType (*u->targetType))
                    return true;

                if (! shouldIgnoreErrors)
                    u->targetType->context.throwError (Errors::expectedType());

                return false;
            }
            else if (auto pa = cast<AST::ProcessorAliasDeclaration> (param))
            {
                if (pa->targetProcessor == nullptr)
                    return true;

                pa->resolvedProcessor = pa->targetProcessor->getAsProcessor();

                if (pa->resolvedProcessor != nullptr)
                    return true;

                if (! shouldIgnoreErrors)
                    pa->targetProcessor->context.throwError (Errors::expectedProcessorName());

                return false;
            }
            else if (auto v = cast<AST::VariableDeclaration> (param))
            {
                if (v->initialValue == nullptr)
                    return true;

                if (AST::isResolvedAsValue (*v->initialValue))
                    return true;

                if (! shouldIgnoreErrors)
                    v->initialValue->context.throwError (Errors::expectedValue());

                return false;
            }
            else if (auto n = cast<AST::NamespaceAliasDeclaration> (param))
            {
                if (n->targetNamespace == nullptr)
                    return true;

                n->resolvedNamespace = n->targetNamespace->getAsNamespace();

                if (n->resolvedNamespace != nullptr)
                    return true;

                if (! shouldIgnoreErrors)
                    n->targetNamespace->context.throwError (Errors::expectedNamespaceName());

                return false;
            }

            return false;
        }